

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void opengv::relative_pose::modules::fivept_kneip_main
               (Matrix<double,_3,_5,_0,_3,_5> *f1,Matrix<double,_3,_5,_0,_3,_5> *f2,
               rotations_t *rotations)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Matrix<double,_3,_5,_0,_3,_5> *pMVar17;
  iterator __position;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
  *this;
  long lVar31;
  ulong uVar32;
  ActualDstType actualDst;
  double *pdVar33;
  long lVar34;
  double *pdVar35;
  uint i;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  long lVar36;
  double *pdVar37;
  ulong uVar38;
  ulong uVar39;
  bool bVar40;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  double dVar73;
  Packet2d mask;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  double dVar108;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  c_2;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  c_1;
  rotation_t finalRotation;
  Matrix3d temp2;
  Matrix3d temp1;
  Matrix<std::complex<double>,_20,_1,_0,_20,_1> D;
  Matrix<std::complex<double>,_20,_20,_0,_20,_20> V;
  Matrix<double,_20,_20,_0,_20,_20> M;
  EigenSolver<Eigen::Matrix<double,_20,_20,_0,_20,_20>_> Eig;
  Matrix<double,_66,_197,_0,_66,_197> groebnerMatrix;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  vStack_20610;
  vector<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  vStack_205f0;
  Matrix<double,_3,_5,_0,_3,_5> *pMStack_205d0;
  Matrix<double,_3,_5,_0,_3,_5> *pMStack_205c8;
  Matrix<double,_3,_3,_0,_3,_3> MStack_205c0;
  undefined1 auStack_20550 [16];
  undefined1 auStack_20540 [16];
  undefined1 auStack_20530 [16];
  undefined1 auStack_20520 [16];
  undefined1 auStack_20510 [16];
  undefined1 auStack_20500 [16];
  double dStack_204f0;
  double dStack_204e8;
  double dStack_204e0;
  double dStack_204d8;
  double dStack_204d0;
  double dStack_204c8;
  double dStack_204c0;
  undefined1 auStack_204a0 [16];
  undefined1 auStack_20490 [16];
  undefined1 auStack_20480 [16];
  double dStack_20470;
  double dStack_20468;
  double dStack_20460;
  double dStack_20458;
  double dStack_20450;
  double dStack_20448;
  double dStack_20440;
  undefined1 auStack_20420 [16];
  undefined1 auStack_20410 [16];
  undefined1 auStack_20400 [16];
  undefined1 auStack_203f0 [16];
  undefined1 auStack_203e0 [16];
  undefined1 auStack_203d0 [16];
  undefined1 auStack_203c0 [16];
  undefined1 auStack_203b0 [16];
  undefined1 auStack_203a0 [16];
  undefined1 auStack_20390 [16];
  undefined1 auStack_20380 [16];
  undefined1 auStack_20370 [16];
  undefined1 auStack_20360 [16];
  undefined1 auStack_20350 [16];
  undefined1 auStack_20340 [16];
  undefined1 auStack_20330 [16];
  undefined1 auStack_20320 [16];
  undefined1 auStack_20310 [16];
  undefined1 auStack_20300 [16];
  undefined1 auStack_202f0 [16];
  undefined1 auStack_202e0 [16];
  double dStack_202d0;
  ulong uStack_202c8;
  undefined1 auStack_202c0 [16];
  undefined1 auStack_202b0 [16];
  undefined1 auStack_202a0 [16];
  undefined1 auStack_20290 [16];
  undefined1 auStack_20280 [16];
  undefined1 auStack_20270 [16];
  vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
  *pvStack_20258;
  ulong uStack_20250;
  ulong uStack_20248;
  undefined1 auStack_20240 [16];
  undefined1 auStack_20230 [16];
  undefined1 auStack_20220 [16];
  undefined1 auStack_20210 [16];
  undefined1 auStack_20200 [16];
  undefined8 uStack_201f0;
  undefined8 uStack_201e8;
  undefined1 auStack_201e0 [16];
  double dStack_201d0;
  ulong uStack_201c8;
  double dStack_201c0;
  ulong uStack_201b8;
  undefined1 auStack_201b0 [16];
  undefined1 auStack_201a0 [16];
  undefined1 auStack_20190 [16];
  undefined1 auStack_20180 [16];
  double dStack_20170;
  ulong uStack_20168;
  double dStack_20160;
  ulong uStack_20158;
  undefined1 auStack_20150 [16];
  undefined1 auStack_20140 [16];
  double dStack_20130;
  ulong uStack_20128;
  double dStack_20120;
  ulong uStack_20118;
  undefined1 auStack_20110 [16];
  undefined1 auStack_20100 [8];
  ulong auStack_200f8 [39];
  EigenvectorsType EStack_1ffc0;
  EigenBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_> aEStack_1e6c0 [8];
  double adStack_1e6b8 [29];
  undefined8 uStack_1e5d0;
  undefined8 uStack_1e528;
  undefined8 uStack_1e480;
  undefined8 uStack_1e3d8;
  undefined8 uStack_1e330;
  undefined8 uStack_1e288;
  undefined8 uStack_1e1e0;
  undefined8 uStack_1e138;
  undefined8 uStack_1e090;
  undefined8 uStack_1dae8;
  double adStack_1da50 [2];
  EigenSolver<Eigen::Matrix<double,_20,_20,_0,_20,_20>_> EStack_1da40;
  Matrix<double,_66,_197,_0,_66,_197> MStack_196d0;
  Matrix<double,_3,_5,_0,_3,_5> *pMVar18;
  
  pMStack_205d0 = f1;
  pMStack_205c8 = f2;
  memset(&MStack_196d0,0,0x19650);
  dStack_20440 = 0.0;
  _auStack_20480 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
  dStack_204c0 = 0.0;
  _auStack_20500 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
  vStack_205f0.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_205f0.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Matrix<double,_3,_3,_0,_3,_3> *)0x0;
  vStack_205f0.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (Matrix<double,_3,_3,_0,_3,_3> *)0x0;
  std::
  vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
  ::_M_realloc_insert<Eigen::Matrix<double,3,3,0,3,3>const&>
            ((vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
              *)&vStack_205f0,(iterator)0x0,(Matrix<double,_3,_3,_0,_3,_3> *)auStack_20480);
  if (vStack_205f0.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      vStack_205f0.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
    ::_M_realloc_insert<Eigen::Matrix<double,3,3,0,3,3>const&>
              ((vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
                *)&vStack_205f0,
               (iterator)
               vStack_205f0.
               super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (Matrix<double,_3,_3,_0,_3,_3> *)auStack_20480);
  }
  else {
    ((vStack_205f0.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
         dStack_20440;
    auVar67 = vmovdqa64_avx512f(_auStack_20480);
    auVar67 = vmovdqu64_avx512f(auVar67);
    *(undefined1 (*) [64])
     ((vStack_205f0.
       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->
     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array = auVar67;
    vStack_205f0.
    super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         vStack_205f0.
         super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (vStack_205f0.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      vStack_205f0.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
    ::_M_realloc_insert<Eigen::Matrix<double,3,3,0,3,3>const&>
              ((vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
                *)&vStack_205f0,
               (iterator)
               vStack_205f0.
               super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (Matrix<double,_3,_3,_0,_3,_3> *)auStack_20480);
  }
  else {
    ((vStack_205f0.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
         dStack_20440;
    auVar67 = vmovdqa64_avx512f(_auStack_20480);
    auVar67 = vmovdqu64_avx512f(auVar67);
    *(undefined1 (*) [64])
     ((vStack_205f0.
       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->
     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array = auVar67;
    vStack_205f0.
    super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         vStack_205f0.
         super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  vStack_20610.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_20610.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Matrix<double,_3,_3,_0,_3,_3> *)0x0;
  vStack_20610.
  super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (Matrix<double,_3,_3,_0,_3,_3> *)0x0;
  std::
  vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
  ::_M_realloc_insert<Eigen::Matrix<double,3,3,0,3,3>const&>
            ((vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
              *)&vStack_20610,(iterator)0x0,(Matrix<double,_3,_3,_0,_3,_3> *)auStack_20500);
  if (vStack_20610.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      vStack_20610.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
    ::_M_realloc_insert<Eigen::Matrix<double,3,3,0,3,3>const&>
              ((vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
                *)&vStack_20610,
               (iterator)
               vStack_20610.
               super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (Matrix<double,_3,_3,_0,_3,_3> *)auStack_20500);
  }
  else {
    ((vStack_20610.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
         dStack_204c0;
    auVar67 = vmovdqa64_avx512f(_auStack_20500);
    auVar67 = vmovdqu64_avx512f(auVar67);
    *(undefined1 (*) [64])
     ((vStack_20610.
       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->
     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array = auVar67;
    vStack_20610.
    super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         vStack_20610.
         super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  if (vStack_20610.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      vStack_20610.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
    ::_M_realloc_insert<Eigen::Matrix<double,3,3,0,3,3>const&>
              ((vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
                *)&vStack_20610,
               (iterator)
               vStack_20610.
               super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (Matrix<double,_3,_3,_0,_3,_3> *)auStack_20500);
  }
  else {
    ((vStack_20610.
      super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
         dStack_204c0;
    auVar67 = vmovdqa64_avx512f(_auStack_20500);
    auVar67 = vmovdqu64_avx512f(auVar67);
    *(undefined1 (*) [64])
     ((vStack_20610.
       super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->
     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array = auVar67;
    vStack_20610.
    super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         vStack_20610.
         super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  uVar32 = 0;
  uVar39 = 2;
  uVar38 = 1;
  lVar36 = 0;
  pMVar17 = pMStack_205d0;
  pMVar18 = pMStack_205c8;
  pvStack_20258 =
       (vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
        *)rotations;
  do {
    pdVar37 = (pMVar18->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.
              m_data.array + 3;
    pdVar35 = (pMVar17->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.
              m_data.array + 3;
    auStack_20530._0_8_ = pdVar35;
    auStack_20540._0_8_ = pdVar37;
    auStack_204a0._0_8_ = uVar32;
    auStack_20550._0_8_ = uVar39;
    auStack_20510._0_8_ = uVar38;
    if (uVar32 < 4) {
      lVar34 = uVar32 * 0x18;
      auStack_20520._0_8_ = lVar34;
      do {
        pdVar33 = (double *)
                  ((long)(pMStack_205d0->
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.
                         m_data.array + lVar34);
        dVar2 = *pdVar33;
        dVar3 = pdVar33[1];
        dVar73 = *(double *)
                  ((long)(pMStack_205d0->
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.
                         m_data.array + lVar34 + 0x10);
        lVar31 = 2;
        pdVar33 = pdVar35;
        do {
          dVar1 = *pdVar33;
          adStack_1da50[lVar31] = dVar2 * dVar1;
          adStack_1da50[lVar31 + 1] = dVar3 * dVar1;
          EStack_1da40.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
          m_storage.m_data.array[lVar31] = dVar73 * dVar1;
          lVar31 = lVar31 + 3;
          pdVar33 = pdVar33 + 1;
        } while (lVar31 != 0xb);
        auStack_20480._8_8_ =
             EStack_1da40.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
             m_storage.m_data.array[1];
        auStack_20480._0_8_ =
             EStack_1da40.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
             m_storage.m_data.array[0];
        dStack_20470 = EStack_1da40.m_eivec.
                       super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
                       m_data.array[2];
        dStack_20468 = EStack_1da40.m_eivec.
                       super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
                       m_data.array[3];
        dStack_20460 = EStack_1da40.m_eivec.
                       super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
                       m_data.array[4];
        dStack_20458 = EStack_1da40.m_eivec.
                       super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
                       m_data.array[5];
        dStack_20450 = EStack_1da40.m_eivec.
                       super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
                       m_data.array[6];
        dStack_20448 = EStack_1da40.m_eivec.
                       super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
                       m_data.array[7];
        dStack_20440 = EStack_1da40.m_eivec.
                       super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
                       m_data.array[8];
        pdVar33 = (double *)
                  ((long)(pMStack_205c8->
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.
                         m_data.array + lVar34);
        dVar2 = *pdVar33;
        dVar3 = pdVar33[1];
        dVar73 = *(double *)
                  ((long)(pMStack_205c8->
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.
                         m_data.array + lVar34 + 0x10);
        lVar31 = 2;
        pdVar33 = pdVar37;
        do {
          dVar1 = *pdVar33;
          auVar41._0_8_ = dVar2 * dVar1;
          auVar41._8_8_ = dVar3 * dVar1;
          *(undefined1 (*) [16])(adStack_1da50 + lVar31) = auVar41;
          EStack_1da40.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
          m_storage.m_data.array[lVar31] = dVar73 * dVar1;
          lVar31 = lVar31 + 3;
          pdVar33 = pdVar33 + 1;
        } while (lVar31 != 0xb);
        auStack_20500._8_8_ =
             EStack_1da40.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
             m_storage.m_data.array[1];
        auStack_20500._0_8_ =
             EStack_1da40.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
             m_storage.m_data.array[0];
        dStack_204f0 = EStack_1da40.m_eivec.
                       super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
                       m_data.array[2];
        dStack_204e8 = EStack_1da40.m_eivec.
                       super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
                       m_data.array[3];
        dStack_204e0 = EStack_1da40.m_eivec.
                       super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
                       m_data.array[4];
        dStack_204d8 = EStack_1da40.m_eivec.
                       super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
                       m_data.array[5];
        dStack_204d0 = EStack_1da40.m_eivec.
                       super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
                       m_data.array[6];
        dStack_204c8 = EStack_1da40.m_eivec.
                       super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
                       m_data.array[7];
        dStack_204c0 = EStack_1da40.m_eivec.
                       super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
                       m_data.array[8];
        if (uVar38 < 4) {
          lVar36 = (long)(int)lVar36;
          auStack_20490._0_8_ = uVar39;
          do {
            dVar73 = (pMStack_205d0->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                     m_storage.m_data.array[uVar39 * 3];
            ((vStack_205f0.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
                 = dVar73 * (double)auStack_20480._0_8_;
            ((vStack_205f0.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
                 = dVar73 * (double)auStack_20480._8_8_;
            ((vStack_205f0.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
                 = dVar73 * dStack_20470;
            ((vStack_205f0.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
                 = dVar73 * dStack_20468;
            ((vStack_205f0.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
                 = dVar73 * dStack_20460;
            ((vStack_205f0.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
                 = dVar73 * dStack_20458;
            ((vStack_205f0.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
                 = dVar73 * dStack_20450;
            ((vStack_205f0.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
                 = dVar73 * dStack_20448;
            ((vStack_205f0.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
                 = dVar73 * dStack_20440;
            dVar73 = (pMStack_205d0->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                     m_storage.m_data.array[uVar39 * 3 + 1];
            vStack_205f0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
                 (double)auStack_20480._0_8_ * dVar73;
            vStack_205f0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
                 (double)auStack_20480._8_8_ * dVar73;
            vStack_205f0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
                 dVar73 * dStack_20470;
            vStack_205f0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
                 dVar73 * dStack_20468;
            vStack_205f0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
                 dVar73 * dStack_20460;
            vStack_205f0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
                 dVar73 * dStack_20458;
            vStack_205f0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
                 dVar73 * dStack_20450;
            vStack_205f0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
                 dVar73 * dStack_20448;
            vStack_205f0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
                 dVar73 * dStack_20440;
            dVar73 = (pMStack_205d0->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                     m_storage.m_data.array[uVar39 * 3 + 2];
            vStack_205f0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
                 (double)auStack_20480._0_8_ * dVar73;
            vStack_205f0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
                 (double)auStack_20480._8_8_ * dVar73;
            vStack_205f0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
                 dStack_20470 * dVar73;
            vStack_205f0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
                 dStack_20468 * dVar73;
            vStack_205f0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
                 dStack_20460 * dVar73;
            vStack_205f0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
                 dStack_20458 * dVar73;
            vStack_205f0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
                 dStack_20450 * dVar73;
            vStack_205f0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
                 dStack_20448 * dVar73;
            vStack_205f0.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
                 dStack_20440 * dVar73;
            dVar73 = (pMStack_205c8->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                     m_storage.m_data.array[uVar39 * 3];
            ((vStack_20610.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0]
                 = dVar73 * (double)auStack_20500._0_8_;
            ((vStack_20610.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1]
                 = dVar73 * (double)auStack_20500._8_8_;
            ((vStack_20610.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2]
                 = dVar73 * dStack_204f0;
            ((vStack_20610.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3]
                 = dVar73 * dStack_204e8;
            ((vStack_20610.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4]
                 = dVar73 * dStack_204e0;
            ((vStack_20610.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5]
                 = dVar73 * dStack_204d8;
            ((vStack_20610.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6]
                 = dVar73 * dStack_204d0;
            ((vStack_20610.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7]
                 = dVar73 * dStack_204c8;
            ((vStack_20610.
              super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8]
                 = dVar73 * dStack_204c0;
            dVar73 = (pMStack_205c8->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                     m_storage.m_data.array[uVar39 * 3 + 1];
            vStack_20610.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
                 (double)auStack_20500._0_8_ * dVar73;
            vStack_20610.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
                 (double)auStack_20500._8_8_ * dVar73;
            vStack_20610.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
                 dVar73 * dStack_204f0;
            vStack_20610.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
                 dVar73 * dStack_204e8;
            vStack_20610.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
                 dVar73 * dStack_204e0;
            vStack_20610.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
                 dVar73 * dStack_204d8;
            vStack_20610.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
                 dVar73 * dStack_204d0;
            vStack_20610.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
                 dVar73 * dStack_204c8;
            vStack_20610.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
                 dVar73 * dStack_204c0;
            dVar73 = (pMStack_205c8->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                     m_storage.m_data.array[uVar39 * 3 + 2];
            vStack_20610.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
                 (double)auStack_20500._0_8_ * dVar73;
            vStack_20610.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
                 (double)auStack_20500._8_8_ * dVar73;
            vStack_20610.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
                 dStack_204f0 * dVar73;
            vStack_20610.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
                 dStack_204e8 * dVar73;
            vStack_20610.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] =
                 dStack_204e0 * dVar73;
            vStack_20610.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] =
                 dStack_204d8 * dVar73;
            vStack_20610.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] =
                 dStack_204d0 * dVar73;
            vStack_20610.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
                 dStack_204c8 * dVar73;
            vStack_20610.
            super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
                 dStack_204c0 * dVar73;
            fivept_kneip::initEpncpRowR
                      ((Matrix<double,_1,_197,_1,_1,_197> *)&EStack_1da40,&vStack_205f0,
                       &vStack_20610);
            lVar34 = 0;
            auVar67 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            auVar68 = vpbroadcastq_avx512f(ZEXT816(0xc5));
            auVar69 = vpbroadcastq_avx512f(ZEXT816(0x210));
            auVar70 = vpbroadcastq_avx512f(ZEXT816(8));
            do {
              uVar32 = vpcmpuq_avx512f(auVar67,auVar68,1);
              auVar71 = vpmullq_avx512dq(auVar67,auVar69);
              lVar31 = lVar34 * 8;
              auVar72._8_8_ =
                   (ulong)((byte)(uVar32 >> 1) & 1) *
                   *(long *)((long)EStack_1da40.m_eivec.
                                   super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
                                   m_storage.m_data.array + lVar31 + 8);
              auVar72._0_8_ =
                   (ulong)((byte)uVar32 & 1) *
                   (long)EStack_1da40.m_eivec.
                         super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.m_storage.
                         m_data.array[lVar34];
              auVar72._16_8_ =
                   (ulong)((byte)(uVar32 >> 2) & 1) *
                   *(long *)((long)EStack_1da40.m_eivec.
                                   super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
                                   m_storage.m_data.array + lVar31 + 0x10);
              auVar72._24_8_ =
                   (ulong)((byte)(uVar32 >> 3) & 1) *
                   *(long *)((long)EStack_1da40.m_eivec.
                                   super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
                                   m_storage.m_data.array + lVar31 + 0x18);
              auVar72._32_8_ =
                   (ulong)((byte)(uVar32 >> 4) & 1) *
                   *(long *)((long)EStack_1da40.m_eivec.
                                   super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
                                   m_storage.m_data.array + lVar31 + 0x20);
              auVar72._40_8_ =
                   (ulong)((byte)(uVar32 >> 5) & 1) *
                   *(long *)((long)EStack_1da40.m_eivec.
                                   super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
                                   m_storage.m_data.array + lVar31 + 0x28);
              auVar72._48_8_ =
                   (ulong)((byte)(uVar32 >> 6) & 1) *
                   *(long *)((long)EStack_1da40.m_eivec.
                                   super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
                                   m_storage.m_data.array + lVar31 + 0x30);
              auVar72._56_8_ =
                   (uVar32 >> 7) *
                   *(long *)((long)EStack_1da40.m_eivec.
                                   super_PlainObjectBase<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>.
                                   m_storage.m_data.array + lVar31 + 0x38);
              vscatterqpd_avx512f(ZEXT864(MStack_196d0.
                                          super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>
                                          .m_storage.m_data.array + lVar36) + auVar71,uVar32,auVar72
                                 );
              lVar34 = lVar34 + 8;
              auVar67 = vpaddq_avx512f(auVar67,auVar70);
            } while (lVar34 != 200);
            lVar36 = lVar36 + 1;
            bVar40 = uVar39 < 4;
            uVar39 = uVar39 + 1;
          } while (bVar40);
          lVar34 = auStack_20520._0_8_;
          uVar39 = auStack_20490._0_8_;
        }
        uVar38 = uVar38 + 1;
        uVar39 = uVar39 + 1;
        pdVar35 = pdVar35 + 3;
        pdVar37 = pdVar37 + 3;
      } while (uVar38 != 5);
    }
    uVar32 = auStack_204a0._0_8_ + 1;
    uVar39 = auStack_20550._0_8_ + 1;
    uVar38 = auStack_20510._0_8_ + 1;
    pMVar17 = (Matrix<double,_3,_5,_0,_3,_5> *)auStack_20530._0_8_;
    pMVar18 = (Matrix<double,_3,_5,_0,_3,_5> *)auStack_20540._0_8_;
  } while (uVar32 != 5);
  fivept_kneip::initMatrix(&MStack_196d0);
  fivept_kneip::computeBasis(&MStack_196d0);
  memset(aEStack_1e6c0,0,0xc80);
  this = pvStack_20258;
  lVar36 = 0x40;
  pdVar35 = MStack_196d0.super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>.
            m_storage.m_data.array + 0x2ddd;
  do {
    dVar73 = pdVar35[-7];
    *(double *)(aEStack_1e6c0 + lVar36 + -0x40) = -pdVar35[-8];
    *(double *)(aEStack_1e6c0 + lVar36 + -0x38) = -dVar73;
    dVar73 = pdVar35[-5];
    *(double *)(aEStack_1e6c0 + lVar36 + -0x30) = -pdVar35[-6];
    *(double *)(aEStack_1e6c0 + lVar36 + -0x28) = -dVar73;
    dVar73 = pdVar35[-3];
    *(double *)(aEStack_1e6c0 + lVar36 + -0x20) = -pdVar35[-4];
    *(double *)(aEStack_1e6c0 + lVar36 + -0x18) = -dVar73;
    dVar73 = pdVar35[-1];
    *(double *)(aEStack_1e6c0 + lVar36 + -0x10) = -pdVar35[-2];
    *(double *)(aEStack_1e6c0 + lVar36 + -8) = -dVar73;
    dVar73 = pdVar35[1];
    *(double *)(aEStack_1e6c0 + lVar36) = -*pdVar35;
    *(double *)((long)adStack_1e6b8 + lVar36) = -dVar73;
    lVar36 = lVar36 + 0xa0;
    pdVar35 = pdVar35 + 0x42;
  } while (lVar36 != 0xcc0);
  uStack_1e5d0 = 0x3ff0000000000000;
  uStack_1e528 = 0x3ff0000000000000;
  uStack_1e480 = 0x3ff0000000000000;
  uStack_1e3d8 = 0x3ff0000000000000;
  uStack_1e330 = 0x3ff0000000000000;
  uStack_1e288 = 0x3ff0000000000000;
  uStack_1e1e0 = 0x3ff0000000000000;
  uStack_1e138 = 0x3ff0000000000000;
  uStack_1e090 = 0x3ff0000000000000;
  uStack_1dae8 = 0x3ff0000000000000;
  EStack_1da40.m_realSchur.m_hess.m_isInitialized = false;
  EStack_1da40.m_realSchur.m_isInitialized = false;
  EStack_1da40.m_realSchur.m_matUisUptodate = false;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[1]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[1]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[2]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[2]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[3]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[3]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[4]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[4]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[5]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[5]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[6]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[6]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[7]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[7]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[8]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[8]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[9]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[9]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[10]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[10]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0xb]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0xb]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0xc]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0xc]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0xd]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0xd]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0xe]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0xe]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0xf]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0xf]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0x10]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0x10]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0x11]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0x11]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0x12]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0x12]._M_value._8_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0x13]._M_value._0_8_ = 0;
  EStack_1da40.m_eivalues.
  super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_20,_1,_0,_20,_1>_>.m_storage.m_data.
  array[0x13]._M_value._8_8_ = 0;
  EStack_1da40.m_isInitialized = false;
  EStack_1da40.m_eigenvectorsOk = false;
  EStack_1da40.m_realSchur.m_maxIters = -1;
  Eigen::EigenSolver<Eigen::Matrix<double,20,20,0,20,20>>::
  compute<Eigen::Matrix<double,20,20,0,20,20>>
            ((EigenSolver<Eigen::Matrix<double,20,20,0,20,20>> *)&EStack_1da40,aEStack_1e6c0,true);
  memcpy(auStack_20100,&EStack_1da40.m_eivalues,0x140);
  Eigen::EigenSolver<Eigen::Matrix<double,_20,_20,_0,_20,_20>_>::eigenvectors
            (&EStack_1ffc0,&EStack_1da40);
  MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [0] = 0.0;
  MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [1] = 0.0;
  MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [2] = 0.0;
  MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [3] = 0.0;
  MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [4] = 0.0;
  MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [5] = 0.0;
  MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [6] = 0.0;
  MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [7] = 0.0;
  MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
  [8] = 0.0;
  lVar36 = 0;
  uStack_20250 = 0x8000000000000000;
  uStack_20248 = 0x8000000000000000;
  uStack_201f0 = 0x7fffffffffffffff;
  uStack_201e8 = 0x7fffffffffffffff;
  do {
    auVar42._8_8_ = 0;
    auVar42._0_8_ = auStack_200f8[lVar36 * 2];
    auVar44._8_8_ = 0x7fffffffffffffff;
    auVar44._0_8_ = 0x7fffffffffffffff;
    auVar41 = vandpd_avx512vl(auVar42,auVar44);
    auVar43 = auStack_20270;
    if (auVar41._0_8_ < 0.1) {
      lVar34 = lVar36 * 0x140;
      MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[0] = (double)__divdc3();
      MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[3] = (double)__divdc3(*(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x17f0),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x17e8),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x17d0),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x17c8));
      MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[6] = (double)__divdc3(*(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x1800),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x17f8),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x17d0),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x17c8));
      MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[1] = (double)__divdc3(*(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x1810),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x1808),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x17d0),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x17c8));
      MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[4] = (double)__divdc3(*(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x1820),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x1818),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x17d0),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x17c8));
      MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[7] = (double)__divdc3(*(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x1830),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x1828),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x17d0),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x17c8));
      MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[2] = (double)__divdc3(*(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x1840),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x1838),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x17d0),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x17c8));
      MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[5] = (double)__divdc3(*(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x1850),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x1848),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x17d0),
                                  *(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x17c8));
      dVar73 = (double)__divdc3(*(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x1860),
                                *(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x1858),
                                *(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x17d0),
                                *(undefined8 *)(aEStack_1e6c0 + lVar34 + -0x17c8));
      auVar49._8_8_ = 0;
      auVar49._0_8_ =
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[2];
      auVar54._8_8_ = 0;
      auVar54._0_8_ =
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[5];
      auVar43 = vunpcklpd_avx(auVar49,auVar54);
      auVar46._8_8_ = dVar73;
      auVar46._0_8_ =
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[7];
      auVar55._0_8_ =
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[7] *
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[7];
      auVar55._8_8_ = dVar73 * dVar73;
      auVar51._8_8_ = 0;
      auVar51._0_8_ =
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[1] *
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[1] +
           auVar55._0_8_ +
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[4] *
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[4];
      auVar44 = vsqrtpd_avx(auVar51);
      auVar100._0_8_ =
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[1] / auVar44._0_8_;
      auVar100._8_8_ = 0;
      auVar131._0_8_ =
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[4] / auVar44._0_8_;
      auVar131._8_8_ = 0;
      auVar41 = vshufpd_avx(auVar55,auVar55,1);
      auVar47._8_8_ = 0;
      auVar47._0_8_ =
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[2] *
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[2] +
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[5] *
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[5] + auVar41._0_8_;
      auVar41 = vsqrtpd_avx(auVar47);
      auVar48._8_8_ = auVar41._0_8_;
      auVar48._0_8_ = auVar41._0_8_;
      auVar42 = vdivpd_avx512vl(auVar43,auVar48);
      MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[2] = (double)vmovlpd_avx512f(auVar42);
      auVar43 = vshufpd_avx512vl(auVar42,auVar42,1);
      MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[5] = (double)vmovhpd_avx512f(auVar42);
      auVar41 = vunpcklpd_avx(auVar44,auVar41);
      auVar41 = vdivpd_avx(auVar46,auVar41);
      MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[7] = auVar41._0_8_;
      MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[8] = auVar41._8_8_;
      auVar52._8_8_ = 0;
      auVar52._0_8_ =
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[7];
      dVar73 = auVar43._0_8_;
      auStack_20490 = vshufpd_avx(auVar41,auVar41,1);
      auVar53._8_8_ = 0;
      auVar53._0_8_ =
           dVar73 * MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                    m_storage.m_data.array[7];
      auVar41 = vfmsub231sd_fma(auVar53,auVar131,auStack_20490);
      auVar44 = vmulsd_avx512f(auVar42,auVar52);
      auVar44 = vfmsub231sd_fma(auVar44,auVar100,auStack_20490);
      auVar45 = vmulsd_avx512f(auVar42,auVar131);
      auVar43 = vfmsub231sd_fma(auVar45,auVar100,auVar43);
      auVar45._8_8_ = 0x7fffffffffffffff;
      auVar45._0_8_ = 0x7fffffffffffffff;
      auVar50._8_8_ = 0;
      auVar50._0_8_ =
           auVar43._0_8_ *
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[6] +
           (auVar41._0_8_ *
            MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
            m_data.array[0] -
           auVar44._0_8_ *
           MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
           m_data.array[3]) + -1.0;
      auVar41 = vandpd_avx512vl(auVar50,auVar45);
      MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[1] = auVar100._0_8_;
      MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
      array[4] = auVar131._0_8_;
      auVar43 = auStack_20270;
      if (auVar41._0_8_ < 0.1) {
        auVar56._8_8_ = auVar100._0_8_;
        auVar56._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[0];
        dVar2 = (pMStack_205c8->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                m_storage.m_data.array[0];
        auStack_202a0._8_8_ = dVar2;
        auStack_202a0._0_8_ = dVar2;
        auVar136._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[0] * dVar2;
        auVar136._8_8_ = auVar100._0_8_ * dVar2;
        auVar58._8_8_ = auVar131._0_8_;
        auVar58._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[3];
        dVar3 = (pMStack_205c8->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                m_storage.m_data.array[1];
        auStack_20290._8_8_ = dVar3;
        auStack_20290._0_8_ = dVar3;
        auVar41 = vfmadd231pd_fma(auVar136,auVar58,auStack_20290);
        auVar59._8_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[7];
        auVar59._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[6];
        dVar1 = (pMStack_205c8->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                m_storage.m_data.array[2];
        auStack_20280._8_8_ = dVar1;
        auStack_20280._0_8_ = dVar1;
        auVar41 = vfmadd231pd_fma(auVar41,auVar59,auStack_20280);
        auVar44 = vmulsd_avx512f(auVar42,auStack_202a0);
        dVar19 = auVar44._0_8_ + dVar73 * dVar3 + (double)auStack_20490._0_8_ * dVar1;
        auStack_20530._0_8_ = dVar19;
        dVar3 = (pMStack_205d0->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                m_storage.m_data.array[0];
        auVar119._8_8_ = 0;
        auVar119._0_8_ = dVar3;
        dVar1 = (pMStack_205d0->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                m_storage.m_data.array[1];
        auStack_20540._8_8_ = 0;
        auStack_20540._0_8_ = dVar1;
        dVar4 = (pMStack_205d0->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                m_storage.m_data.array[2];
        auStack_20550 = vshufpd_avx512vl(auVar41,auVar41,1);
        auVar63._8_8_ = uStack_20248;
        auVar63._0_8_ = uStack_20250;
        auVar64._0_8_ = (ulong)dVar3 ^ uStack_20250;
        auVar64._8_8_ = uStack_20248;
        auVar62._8_8_ = 0;
        auVar62._0_8_ = dVar19;
        auVar45 = vmulsd_avx512f(auVar62,auVar64);
        dVar3 = (pMStack_205c8->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                m_storage.m_data.array[3];
        auStack_202f0._8_8_ = dVar3;
        auStack_202f0._0_8_ = dVar3;
        auVar44 = vmulpd_avx512vl(auVar56,auStack_202f0);
        dVar5 = (pMStack_205c8->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                m_storage.m_data.array[4];
        auStack_202e0._8_8_ = dVar5;
        auStack_202e0._0_8_ = dVar5;
        auVar44 = vfmadd231pd_avx512vl(auVar44,auVar58,auStack_202e0);
        dVar6 = (pMStack_205c8->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                m_storage.m_data.array[5];
        auStack_202c0._8_8_ = dVar6;
        auStack_202c0._0_8_ = dVar6;
        auVar46 = vfmadd231pd_avx512vl(auVar44,auVar59,auStack_202c0);
        auVar44 = vmulsd_avx512f(auVar42,auStack_202f0);
        auVar109._8_8_ = 0;
        auVar109._0_8_ = (double)auStack_20490._0_8_ * dVar6 + dVar73 * dVar5;
        auVar47 = vaddsd_avx512f(auVar44,auVar109);
        vmovsd_avx512f(auVar47);
        dVar5 = (pMStack_205c8->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                m_storage.m_data.array[6];
        auStack_20320._8_8_ = dVar5;
        auStack_20320._0_8_ = dVar5;
        auVar44 = vmulpd_avx512vl(auVar56,auStack_20320);
        dVar6 = (pMStack_205c8->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                m_storage.m_data.array[7];
        auStack_20310._8_8_ = dVar6;
        auStack_20310._0_8_ = dVar6;
        auVar44 = vfmadd231pd_avx512vl(auVar44,auVar58,auStack_20310);
        dVar7 = (pMStack_205c8->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                m_storage.m_data.array[8];
        auStack_20300._8_8_ = dVar7;
        auStack_20300._0_8_ = dVar7;
        auVar48 = vfmadd231pd_avx512vl(auVar44,auVar59,auStack_20300);
        auVar44 = vmulsd_avx512f(auVar42,auStack_20320);
        auVar129._8_8_ = 0;
        auVar129._0_8_ = dVar6 * dVar73 + (double)auStack_20490._0_8_ * dVar7;
        auVar49 = vaddsd_avx512f(auVar44,auVar129);
        dVar6 = (pMStack_205c8->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                m_storage.m_data.array[9];
        auStack_20350._8_8_ = dVar6;
        auStack_20350._0_8_ = dVar6;
        auVar159._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[0] * dVar6;
        auVar159._8_8_ = auVar100._0_8_ * dVar6;
        dVar7 = (pMStack_205c8->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                m_storage.m_data.array[10];
        auStack_20340._8_8_ = dVar7;
        auStack_20340._0_8_ = dVar7;
        auVar44 = vfmadd231pd_fma(auVar159,auVar58,auStack_20340);
        dVar8 = (pMStack_205c8->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                m_storage.m_data.array[0xb];
        auStack_20330._8_8_ = dVar8;
        auStack_20330._0_8_ = dVar8;
        auVar44 = vfmadd231pd_fma(auVar44,auVar59,auStack_20330);
        auVar50 = vmulsd_avx512f(auVar42,auStack_20350);
        auStack_203d0._8_8_ = 0;
        auStack_203d0._0_8_ = dVar4;
        auVar132._8_8_ = 0;
        auVar132._0_8_ = dVar7 * dVar73 + (double)auStack_20490._0_8_ * dVar8;
        auVar50 = vaddsd_avx512f(auVar50,auVar132);
        dVar7 = (pMStack_205c8->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                m_storage.m_data.array[0xc];
        auStack_20380._8_8_ = dVar7;
        auStack_20380._0_8_ = dVar7;
        auVar51 = vmulpd_avx512vl(auVar56,auStack_20380);
        dVar8 = (pMStack_205c8->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                m_storage.m_data.array[0xd];
        auStack_20370._8_8_ = dVar8;
        auStack_20370._0_8_ = dVar8;
        auVar51 = vfmadd231pd_avx512vl(auVar51,auStack_20370,auVar58);
        dVar9 = (pMStack_205c8->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                m_storage.m_data.array[0xe];
        auStack_20360._8_8_ = dVar9;
        auStack_20360._0_8_ = dVar9;
        auVar51 = vfmadd231pd_avx512vl(auVar51,auStack_20360,auVar59);
        auVar52 = vmulsd_avx512f(auVar42,auStack_20380);
        dVar20 = auVar52._0_8_ + dVar73 * dVar8 + (double)auStack_20490._0_8_ * dVar9;
        auVar52 = vmulsd_avx512f(auVar41,auStack_20540);
        vmovsd_avx512f(auVar45);
        auVar45 = vfmadd213sd_avx512f(auVar41,auStack_203d0,auVar45);
        auVar52 = vfmsub231sd_avx512f(auVar52,auVar119,auStack_20550);
        dVar73 = (pMStack_205d0->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                 m_storage.m_data.array[3];
        auStack_203f0._8_8_ = 0;
        auStack_203f0._0_8_ = dVar73;
        auVar65._0_8_ = (ulong)dVar73 ^ uStack_20250;
        auVar65._8_8_ = uStack_20248;
        auVar47 = vmulsd_avx512f(auVar47,auVar65);
        dVar73 = (pMStack_205d0->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                 m_storage.m_data.array[4];
        dVar8 = (pMStack_205d0->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                m_storage.m_data.array[5];
        auVar53 = vshufpd_avx512vl(auVar46,auVar46,1);
        auVar181._8_8_ = 0;
        auVar181._0_8_ = dVar73;
        auVar41 = vmulsd_avx512f(auVar46,auVar181);
        auStack_203e0._0_8_ = auVar47._0_8_;
        auStack_20410._8_8_ = 0;
        auStack_20410._0_8_ = dVar8;
        auVar46 = vfmadd213sd_avx512f(auVar46,auStack_20410,auVar47);
        auVar54 = vfmsub231sd_avx512f(auVar41,auStack_203f0,auVar53);
        dVar9 = (pMStack_205d0->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                m_storage.m_data.array[6];
        auStack_203b0._8_8_ = 0;
        auStack_203b0._0_8_ = dVar9;
        auVar66._0_8_ = (ulong)dVar9 ^ uStack_20250;
        auVar66._8_8_ = uStack_20248;
        auVar55 = vmulsd_avx512f(auVar49,auVar66);
        dVar9 = (pMStack_205d0->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                m_storage.m_data.array[7];
        dVar10 = (pMStack_205d0->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                 m_storage.m_data.array[8];
        auVar130._8_8_ = 0;
        auVar130._0_8_ = dVar10;
        auVar56 = vshufpd_avx512vl(auVar48,auVar48,1);
        auVar183._8_8_ = 0;
        auVar183._0_8_ = dVar9;
        auVar41 = vmulsd_avx512f(auVar48,auVar183);
        auStack_202b0._0_8_ = auVar55._0_8_;
        auVar48 = vfmadd213sd_avx512f(auVar48,auVar130,auVar55);
        auVar57 = vfmsub231sd_avx512f(auVar41,auStack_203b0,auVar56);
        auVar41 = vmulsd_avx512f(auVar54,auVar48);
        auVar58 = vfmsub231sd_avx512f(auVar41,auVar46,auVar57);
        auVar41 = vmulsd_avx512f(auVar52,auVar46);
        auVar59 = vfmsub231sd_avx512f(auVar41,auVar45,auVar54);
        dVar11 = (pMStack_205d0->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                 m_storage.m_data.array[9];
        auStack_20400._8_8_ = 0;
        auStack_20400._0_8_ = dVar11;
        auVar133._0_8_ = (ulong)dVar11 ^ uStack_20250;
        auVar133._8_8_ = uStack_20248;
        auVar60 = vmulsd_avx512f(auVar50,auVar133);
        dVar11 = (pMStack_205d0->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                 m_storage.m_data.array[10];
        dVar12 = (pMStack_205d0->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                 m_storage.m_data.array[0xb];
        auVar41 = vshufpd_avx(auVar44,auVar44,1);
        auVar177._8_8_ = 0;
        auVar177._0_8_ = dVar11;
        auVar61 = vmulsd_avx512f(auVar44,auVar177);
        dStack_202d0 = auVar60._0_8_;
        auVar185._8_8_ = 0;
        auVar185._0_8_ = dVar12;
        auVar60 = vfmadd213sd_avx512f(auVar44,auVar185,auVar60);
        auVar44 = vfmsub231sd_fma(auVar61,auStack_20400,auVar41);
        auVar61 = vmulsd_avx512f(auVar54,auVar60);
        auVar62 = vfmsub231sd_avx512f(auVar61,auVar46,auVar44);
        dVar108 = (pMStack_205d0->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                  m_storage.m_data.array[0xc];
        auStack_20420._8_8_ = 0;
        auStack_20420._0_8_ = dVar108;
        auVar63 = vxorpd_avx512vl(auStack_20420,auVar63);
        auVar140._8_8_ = 0;
        auVar140._0_8_ = dVar20;
        auVar63 = vmulsd_avx512f(auVar140,auVar63);
        auVar104._8_8_ = 0;
        auVar104._0_8_ =
             (pMStack_205d0->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage
             .m_data.array[0xd];
        dVar13 = (pMStack_205d0->super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                 m_storage.m_data.array[0xe];
        auVar64 = vshufpd_avx512vl(auVar51,auVar51,1);
        auVar61 = vmulsd_avx512f(auVar51,auVar104);
        vmovsd_avx512f(auVar63);
        auStack_203a0._8_8_ = 0;
        auStack_203a0._0_8_ = dVar13;
        auVar51 = vfmadd213sd_avx512f(auVar51,auStack_203a0,auVar63);
        auVar180._8_8_ = 0;
        auVar180._0_8_ = dVar108;
        auVar63 = vfmsub231sd_avx512f(auVar61,auVar180,auVar64);
        auVar54 = vmulsd_avx512f(auVar54,auVar51);
        auVar46 = vfmsub231sd_avx512f(auVar54,auVar63,auVar46);
        auVar54 = vmulsd_avx512f(auVar52,auVar48);
        auVar54 = vfmsub231sd_avx512f(auVar54,auVar45,auVar57);
        auVar61 = vmulsd_avx512f(auVar52,auVar60);
        auVar65 = vfmsub231sd_avx512f(auVar61,auVar45,auVar44);
        auVar52 = vmulsd_avx512f(auVar52,auVar51);
        auVar45 = vfmsub231sd_avx512f(auVar52,auVar63,auVar45);
        auVar137._8_8_ = 0;
        auVar137._0_8_ = auVar60._0_8_ * auVar57._0_8_;
        auVar52 = vfmsub231sd_avx512f(auVar137,auVar48,auVar44);
        auVar57 = vmulsd_avx512f(auVar57,auVar51);
        auVar48 = vfmsub231sd_avx512f(auVar57,auVar63,auVar48);
        auVar44 = vmulsd_avx512f(auVar44,auVar51);
        auVar51 = vfmsub231sd_avx512f(auVar44,auVar60,auVar63);
        auVar57._8_8_ = 0;
        auVar57._0_8_ = dVar19;
        auVar110._8_8_ = 0;
        auVar110._0_8_ = dVar4 * (double)auStack_20550._0_8_;
        auVar44 = vfmsub231sd_fma(auVar110,auStack_20540,auVar57);
        auVar176._8_8_ = 0;
        auVar176._0_8_ = dVar8;
        auVar53 = vmulsd_avx512f(auVar53,auVar176);
        auVar60._8_8_ = 0;
        auVar60._0_8_ = auStack_20520._0_8_;
        auVar53 = vfmsub231sd_avx512f(auVar53,auVar181,auVar60);
        dVar108 = auVar44._0_8_;
        auVar57 = vmulsd_avx512f(auVar53,auVar54);
        auVar60 = vmulsd_avx512f(auVar56,auVar130);
        vmovsd_avx512f(auVar49);
        auVar49 = vfmsub231sd_avx512f(auVar60,auVar183,auVar49);
        auVar60 = vmulsd_avx512f(auVar53,auVar65);
        auVar166._8_8_ = 0;
        auVar166._0_8_ = auVar62._0_8_ * dVar108;
        auVar60 = vsubsd_avx512f(auVar166,auVar60);
        auVar41 = vmulsd_avx512f(auVar41,auVar185);
        auVar41 = vfmsub231sd_avx512f(auVar41,auVar177,auVar50);
        auVar56 = vmulsd_avx512f(auVar59,auVar41);
        auVar60 = vaddsd_avx512f(auVar56,auVar60);
        auVar61._8_8_ = uStack_201e8;
        auVar61._0_8_ = uStack_201f0;
        auVar124._8_8_ = 0;
        auVar124._0_8_ = auVar59._0_8_ * auVar49._0_8_ + (dVar108 * auVar58._0_8_ - auVar57._0_8_);
        auVar57 = vandpd_avx512vl(auVar124,auVar61);
        auVar60 = vandpd_avx512vl(auVar60,auVar61);
        auVar56 = vmulsd_avx512f(auVar44,auVar46);
        auVar63 = vmulsd_avx512f(auVar53,auVar45);
        auVar56 = vsubsd_avx512f(auVar56,auVar63);
        auVar171._8_8_ = 0;
        auVar171._0_8_ = dVar13;
        auVar63 = vmulsd_avx512f(auVar64,auVar171);
        auStack_203c0._0_8_ = dVar20;
        auVar63 = vfmsub231sd_avx512f(auVar63,auVar104,auVar140);
        auVar59 = vmulsd_avx512f(auVar59,auVar63);
        auVar142._8_8_ = 0;
        auVar142._0_8_ = auVar59._0_8_ + auVar56._0_8_;
        auVar56 = vandpd_avx512vl(auVar142,auVar61);
        auVar59 = vmulsd_avx512f(auVar49,auVar65);
        auVar64 = vmulsd_avx512f(auVar54,auVar41);
        auVar143._8_8_ = 0;
        auVar143._0_8_ = auVar64._0_8_ + (auVar52._0_8_ * dVar108 - auVar59._0_8_);
        auVar59 = vandpd_avx512vl(auVar143,auVar61);
        auVar64 = vmulsd_avx512f(auVar44,auVar48);
        auVar66 = vmulsd_avx512f(auVar49,auVar45);
        auVar54 = vmulsd_avx512f(auVar54,auVar63);
        auVar144._8_8_ = 0;
        auVar144._0_8_ = auVar54._0_8_ + (auVar64._0_8_ - auVar66._0_8_);
        auVar54 = vandpd_avx512vl(auVar144,auVar61);
        auVar44 = vmulsd_avx512f(auVar44,auVar51);
        auVar45 = vmulsd_avx512f(auVar41,auVar45);
        auVar64 = vmulsd_avx512f(auVar65,auVar63);
        auVar111._8_8_ = 0;
        auVar111._0_8_ = auVar64._0_8_ + (auVar44._0_8_ - auVar45._0_8_);
        auVar44 = vandpd_avx512vl(auVar111,auVar61);
        auVar125._8_8_ = 0;
        auVar125._0_8_ =
             auVar41._0_8_ * auVar58._0_8_ +
             (auVar52._0_8_ * auVar53._0_8_ - auVar49._0_8_ * auVar62._0_8_);
        auVar45 = vandpd_avx512vl(auVar125,auVar61);
        auVar64 = vmulsd_avx512f(auVar53,auVar48);
        auVar65 = vmulsd_avx512f(auVar49,auVar46);
        auVar58 = vmulsd_avx512f(auVar58,auVar63);
        auVar74._8_8_ = 0;
        auVar74._0_8_ = auVar58._0_8_ + (auVar64._0_8_ - auVar65._0_8_);
        auVar58 = vandpd_avx512vl(auVar74,auVar61);
        auVar53 = vmulsd_avx512f(auVar53,auVar51);
        auVar46 = vmulsd_avx512f(auVar41,auVar46);
        auVar62 = vmulsd_avx512f(auVar62,auVar63);
        auVar112._8_8_ = 0;
        auVar112._0_8_ = auVar62._0_8_ + (auVar53._0_8_ - auVar46._0_8_);
        auVar46 = vandpd_avx512vl(auVar112,auVar61);
        auVar49 = vmulsd_avx512f(auVar49,auVar51);
        auVar41 = vmulsd_avx512f(auVar41,auVar48);
        auVar48 = vmulsd_avx512f(auVar52,auVar63);
        auVar113._8_8_ = 0;
        auVar113._0_8_ = auVar48._0_8_ + (auVar49._0_8_ - auVar41._0_8_);
        auVar48 = vandpd_avx512vl(auVar113,auVar61);
        auVar75._8_8_ = 0;
        auVar75._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[0];
        auVar134._8_8_ = 0;
        auVar134._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[3];
        auVar120._8_8_ = 0;
        auVar120._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[3] *
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[3];
        auVar41 = vfmadd231sd_fma(auVar120,auVar75,auVar75);
        auVar126._8_8_ = 0;
        auVar126._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[6];
        auVar41 = vfmadd231sd_fma(auVar41,auVar126,auVar126);
        auVar121._8_8_ = 0;
        auVar121._0_8_ = auVar41._0_8_ + -1.0;
        auVar49 = vandpd_avx512vl(auVar121,auVar61);
        auVar122._8_8_ = 0;
        auVar122._0_8_ = auVar131._0_8_;
        auVar138._8_8_ = 0;
        auVar138._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[3] * auVar131._0_8_;
        auVar41 = vfmadd231sd_fma(auVar138,auVar75,auVar100);
        auVar145._8_8_ = 0;
        auVar145._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[7];
        auVar41 = vfmadd231sd_fma(auVar41,auVar126,auVar145);
        auVar51 = vandpd_avx512vl(auVar41,auVar61);
        auVar139._8_8_ = 0;
        auVar139._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[5];
        auVar160._8_8_ = 0;
        auVar160._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[3] *
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[5];
        auVar41 = vfmadd231sd_avx512f(auVar160,auVar75,auVar42);
        auVar167._8_8_ = 0;
        auVar167._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[8];
        auVar41 = vfmadd231sd_fma(auVar41,auVar126,auVar167);
        auVar52 = vandpd_avx512vl(auVar41,auVar61);
        auVar161._8_8_ = 0;
        auVar161._0_8_ = auVar131._0_8_ * auVar131._0_8_;
        auVar41 = vfmadd231sd_fma(auVar161,auVar100,auVar100);
        auVar41 = vfmadd231sd_fma(auVar41,auVar145,auVar145);
        auVar162._8_8_ = 0;
        auVar162._0_8_ = auVar41._0_8_ + -1.0;
        auVar53 = vandpd_avx512vl(auVar162,auVar61);
        auVar163._8_8_ = 0;
        auVar163._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[5] * auVar131._0_8_;
        auVar41 = vfmadd231sd_avx512f(auVar163,auVar100,auVar42);
        auVar41 = vfmadd231sd_fma(auVar41,auVar145,auVar167);
        auVar63 = vandpd_avx512vl(auVar41,auVar61);
        auVar164._8_8_ = 0;
        auVar164._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[5] *
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[5];
        auVar41 = vfmadd231sd_avx512f(auVar164,auVar42,auVar42);
        auVar41 = vfmadd231sd_fma(auVar41,auVar167,auVar167);
        auVar165._8_8_ = 0;
        auVar165._0_8_ = auVar41._0_8_ + -1.0;
        auVar62 = vandpd_avx512vl(auVar165,auVar61);
        auVar41 = vmulsd_avx512f(auVar122,auVar42);
        auVar41 = vfmsub231sd_fma(auVar41,auVar100,auVar139);
        auVar127._8_8_ = 0;
        auVar127._0_8_ =
             auVar41._0_8_ -
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[6];
        auVar64 = vandpd_avx512vl(auVar127,auVar61);
        auVar101._8_8_ = 0;
        auVar101._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[3] * auVar100._0_8_;
        auVar41 = vfmsub231sd_fma(auVar101,auVar75,auVar122);
        auVar76._8_8_ = 0;
        auVar76._0_8_ =
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[5] *
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[0];
        auVar65 = vfmsub231sd_avx512f(auVar76,auVar42,auVar134);
        auVar77._8_8_ = 0;
        auVar77._0_8_ =
             auVar65._0_8_ -
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[7];
        auVar65 = vandpd_avx512vl(auVar77,auVar61);
        auVar102._8_8_ = 0;
        auVar102._0_8_ =
             auVar41._0_8_ -
             MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array[8];
        auVar41 = vandpd_avx512vl(auVar102,auVar61);
        auStack_20510 = auVar119;
        auStack_204a0 = auVar42;
        if (auVar41._0_8_ +
            auVar65._0_8_ +
            auVar64._0_8_ +
            auVar62._0_8_ +
            auVar63._0_8_ +
            auVar53._0_8_ +
            auVar52._0_8_ +
            auVar51._0_8_ +
            auVar49._0_8_ +
            auVar48._0_8_ +
            auVar46._0_8_ +
            auVar58._0_8_ +
            auVar45._0_8_ +
            auVar44._0_8_ +
            auVar54._0_8_ + auVar59._0_8_ + auVar56._0_8_ + auVar60._0_8_ + auVar57._0_8_ < 0.001) {
          auVar78._0_8_ =
               MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[0] * dVar2;
          auVar78._8_8_ = auVar100._0_8_ * dVar2;
          auStack_20510._8_8_ = auVar131._0_8_;
          auStack_20510._0_8_ =
               MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[3];
          auVar41 = vfmadd213pd_fma(auStack_20290,auStack_20510,auVar78);
          auVar43._8_8_ =
               MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[7];
          auVar43._0_8_ =
               MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[6];
          auVar44 = vfmadd213pd_fma(auStack_20280,auVar43,auVar41);
          auVar24._8_8_ = uStack_20248;
          auVar24._0_8_ = uStack_20250;
          auVar41 = vshufpd_avx(auVar44,auVar44,1);
          auVar170._8_8_ = 0;
          auVar170._0_8_ = dVar19;
          auVar79._8_8_ = 0;
          auVar79._0_8_ = auVar41._0_8_ * (double)(uStack_20250 ^ (ulong)dVar4);
          auVar45 = vfmadd213sd_fma(auVar170,auStack_20540,auVar79);
          auVar174._8_8_ = 0;
          auVar174._0_8_ = auStack_20270._0_8_;
          auVar48 = vfmadd231sd_avx512f(auVar174,auVar44,auStack_203d0);
          auVar80._8_8_ = 0;
          auVar80._0_8_ = auVar44._0_8_ * (double)(uStack_20250 ^ (ulong)dVar1);
          auVar49 = vfmadd213sd_avx512f(auVar119,auVar41,auVar80);
          auVar81._0_8_ =
               MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[0] * dVar3;
          auVar81._8_8_ = auVar100._0_8_ * dVar3;
          auVar41 = vfmadd213pd_fma(auStack_202e0,auStack_20510,auVar81);
          auVar44 = vfmadd213pd_fma(auStack_202c0,auVar43,auVar41);
          auVar41 = vshufpd_avx(auVar44,auVar44,1);
          auVar168._8_8_ = 0;
          auVar168._0_8_ = auStack_20520._0_8_;
          auVar82._8_8_ = 0;
          auVar82._0_8_ = auVar41._0_8_ * (double)(uStack_20250 ^ (ulong)dVar8);
          auVar182._8_8_ = 0;
          auVar182._0_8_ = dVar73;
          auVar51 = vfmadd213sd_avx512f(auVar168,auVar182,auVar82);
          auVar175._8_8_ = 0;
          auVar175._0_8_ = auVar47._0_8_;
          auVar52 = vfmadd231sd_avx512f(auVar175,auVar44,auStack_20410);
          auVar46 = vxorpd_avx512vl(auVar182,auVar24);
          auVar83._8_8_ = 0;
          auVar83._0_8_ = auVar44._0_8_ * auVar46._0_8_;
          auVar53 = vfmadd213sd_avx512f(auStack_203f0,auVar41,auVar83);
          auVar84._0_8_ =
               MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[0] * dVar5;
          auVar84._8_8_ = auVar100._0_8_ * dVar5;
          auVar41 = vfmadd213pd_fma(auStack_20310,auStack_20510,auVar84);
          auVar44 = vfmadd213pd_fma(auStack_20300,auVar43,auVar41);
          auVar41 = vshufpd_avx(auVar44,auVar44,1);
          auVar85._8_8_ = 0;
          auVar85._0_8_ = auVar41._0_8_ * (double)((ulong)dVar10 ^ uStack_20250);
          auVar173._8_8_ = 0;
          auVar173._0_8_ = auStack_20550._0_8_;
          auVar184._8_8_ = 0;
          auVar184._0_8_ = dVar9;
          auVar54 = vfmadd213sd_avx512f(auVar173,auVar184,auVar85);
          auVar46 = vxorpd_avx512vl(auVar184,auVar24);
          auVar141._8_8_ = 0;
          auVar141._0_8_ = auVar55._0_8_;
          auVar47 = vfmadd231sd_fma(auVar141,auVar44,auVar130);
          auVar186._8_8_ = 0;
          auVar186._0_8_ = dVar12;
          auVar55 = vxorpd_avx512vl(auVar186,auVar24);
          auVar178._8_8_ = 0;
          auVar178._0_8_ = dVar11;
          auVar57 = vxorpd_avx512vl(auVar178,auVar24);
          auVar86._8_8_ = 0;
          auVar86._0_8_ = auVar44._0_8_ * auVar46._0_8_;
          auVar60 = vfmadd213sd_avx512f(auStack_203b0,auVar41,auVar86);
          auVar56 = vxorpd_avx512vl(auStack_203a0,auVar24);
          auVar58 = vxorpd_avx512vl(auVar104,auVar24);
          auVar128._0_8_ =
               MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[0] * dVar6;
          auVar128._8_8_ = auVar100._0_8_ * dVar6;
          auVar41 = vfmadd213pd_avx512vl(auStack_20340,auStack_20510,auVar128);
          auVar41 = vfmadd213pd_avx512vl(auStack_20330,auVar43,auVar41);
          auVar44 = vshufpd_avx512vl(auVar41,auVar41,1);
          auVar114._8_8_ = 0;
          auVar114._0_8_ = auVar44._0_8_ * auVar55._0_8_;
          auVar50 = vfmadd213sd_avx512f(auVar50,auVar178,auVar114);
          auVar105._8_8_ = 0;
          auVar105._0_8_ = auStack_20390._0_8_;
          auVar172._8_8_ = 0;
          auVar172._0_8_ = dStack_202d0;
          auVar55 = vfmadd231sd_avx512f(auVar172,auVar41,auVar186);
          auVar41 = vmulsd_avx512f(auVar41,auVar57);
          auVar46 = vfmadd213sd_fma(auStack_20400,auVar44,auVar41);
          auStack_20550._8_8_ = auVar100._0_8_;
          auStack_20550._0_8_ =
               MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[0];
          auVar115._0_8_ =
               MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[0] * dVar7;
          auVar115._8_8_ = auVar100._0_8_ * dVar7;
          auVar41 = vfmadd213pd_fma(auStack_20370,auStack_20510,auVar115);
          auVar44 = vfmadd213pd_fma(auStack_20360,auVar43,auVar41);
          auVar41 = vshufpd_avx(auVar44,auVar44,1);
          auVar87._8_8_ = 0;
          auVar87._0_8_ = auVar41._0_8_ * auVar56._0_8_;
          auVar179._8_8_ = 0;
          auVar179._0_8_ = dVar20;
          auVar57 = vfmadd213sd_avx512f(auVar179,auVar104,auVar87);
          auVar56 = vfmadd231sd_avx512f(auVar105,auVar44,auStack_203a0);
          auVar88._8_8_ = 0;
          auVar88._0_8_ = auVar44._0_8_ * auVar58._0_8_;
          auVar41 = vfmadd213sd_avx512f(auStack_20420,auVar41,auVar88);
          auVar44 = vmulsd_avx512f(auVar52,auVar49);
          auStack_20280 = vfmsub231sd_avx512f(auVar44,auVar48,auVar53);
          auVar44 = vmulsd_avx512f(auVar53,auVar45);
          auStack_20520 = vfmsub231sd_avx512f(auVar44,auVar49,auVar51);
          auVar44 = vmulsd_avx512f(auVar51,auVar48);
          auStack_20290 = vfmsub231sd_avx512f(auVar44,auVar45,auVar52);
          auVar44 = vmulsd_avx512f(auVar47,auVar49);
          auStack_20530 = vfmsub231sd_avx512f(auVar44,auVar48,auVar60);
          auVar44 = vmulsd_avx512f(auVar60,auVar45);
          auStack_202a0 = vfmsub231sd_avx512f(auVar44,auVar49,auVar54);
          auVar44 = vmulsd_avx512f(auVar54,auVar48);
          auStack_20200 = vfmsub231sd_fma(auVar44,auVar45,auVar47);
          auVar44 = vmulsd_avx512f(auVar55,auVar49);
          auStack_202b0 = vfmsub231sd_avx512f(auVar44,auVar48,auVar46);
          dVar73 = auVar46._0_8_;
          auVar89._8_8_ = 0;
          auVar89._0_8_ = auVar45._0_8_ * dVar73;
          auStack_20540 = vfmsub231sd_avx512f(auVar89,auVar49,auVar50);
          auVar44 = vmulsd_avx512f(auVar50,auVar48);
          auStack_202c0 = vfmsub231sd_avx512f(auVar44,auVar45,auVar55);
          auVar44 = vmulsd_avx512f(auVar56,auVar49);
          auStack_202e0 = vfmsub231sd_avx512f(auVar44,auVar48,auVar41);
          auVar44 = vmulsd_avx512f(auVar41,auVar45);
          auStack_202f0 = vfmsub231sd_avx512f(auVar44,auVar57,auVar49);
          auVar44 = vmulsd_avx512f(auVar57,auVar48);
          auStack_20300 = vfmsub231sd_avx512f(auVar44,auVar56,auVar45);
          auVar44 = vmulsd_avx512f(auVar47,auVar53);
          auStack_20210 = vfmsub231sd_avx512f(auVar44,auVar52,auVar60);
          auVar44 = vmulsd_avx512f(auVar60,auVar51);
          auStack_20340 = vfmsub231sd_avx512f(auVar44,auVar53,auVar54);
          auVar44 = vmulsd_avx512f(auVar54,auVar52);
          auStack_20350 = vfmsub231sd_avx512f(auVar44,auVar51,auVar47);
          auVar44 = vmulsd_avx512f(auVar55,auVar53);
          auStack_20390 = vfmsub231sd_avx512f(auVar44,auVar52,auVar46);
          auVar90._8_8_ = 0;
          auVar90._0_8_ = auVar51._0_8_ * dVar73;
          auStack_20220 = vfmsub231sd_avx512f(auVar90,auVar53,auVar50);
          auVar44 = vmulsd_avx512f(auVar50,auVar52);
          auStack_20230 = vfmsub231sd_avx512f(auVar44,auVar51,auVar55);
          auVar44 = vmulsd_avx512f(auVar41,auVar51);
          auVar44 = vfmsub231sd_avx512f(auVar44,auVar57,auVar53);
          auVar45 = vmulsd_avx512f(auVar56,auVar53);
          auStack_203e0 = vfmsub231sd_avx512f(auVar45,auVar52,auVar41);
          auVar45 = vmulsd_avx512f(auVar57,auVar52);
          auStack_203d0 = vfmsub231sd_fma(auVar45,auVar56,auVar51);
          auVar45 = vmulsd_avx512f(auVar55,auVar60);
          auStack_20240 = vfmsub231sd_fma(auVar45,auVar47,auVar46);
          auVar45 = vmulsd_avx512f(auVar46,auVar54);
          auStack_20420 = vfmsub231sd_avx512f(auVar45,auVar60,auVar50);
          auVar91._8_8_ = 0;
          auVar91._0_8_ = auVar47._0_8_ * auVar50._0_8_;
          auStack_20110 = vfmsub231sd_avx512f(auVar91,auVar54,auVar55);
          auVar45 = vmulsd_avx512f(auVar41,auVar54);
          auVar45 = vfmsub231sd_avx512f(auVar45,auVar57,auVar60);
          auVar48 = vmulsd_avx512f(auVar56,auVar60);
          auVar48 = vfmsub231sd_avx512f(auVar48,auVar47,auVar41);
          auVar47 = vmulsd_avx512f(auVar57,auVar47);
          auStack_20150 = vfmsub231sd_avx512f(auVar47,auVar56,auVar54);
          auVar103._8_8_ = 0;
          auVar103._0_8_ = auVar56._0_8_ * dVar73;
          auStack_201a0 = vfmsub231sd_avx512f(auVar103,auVar55,auVar41);
          auVar41 = vmulsd_avx512f(auVar41,auVar50);
          auStack_20190 = vfmsub231sd_avx512f(auVar41,auVar57,auVar46);
          auVar41 = vmulsd_avx512f(auVar57,auVar55);
          auStack_201b0 = vfmsub231sd_fma(auVar41,auVar50,auVar56);
          lVar34 = 0;
          auVar41 = vxorpd_avx512vl(auStack_20290,auVar24);
          auVar46 = vxorpd_avx512vl(auStack_20280,auVar24);
          auVar47 = vxorpd_avx512vl(auVar24,auStack_20520);
          auVar106._0_8_ = auStack_20200._0_8_ ^ uStack_20250;
          auVar106._8_8_ = auStack_20200._8_8_ ^ uStack_20248;
          auVar107._0_8_ = (double)(uStack_20250 ^ auStack_20530._0_8_);
          auVar107._8_8_ = uStack_20248 ^ auStack_20530._8_8_;
          auVar49 = vxorpd_avx512vl(auStack_202a0,auVar24);
          auVar123._0_8_ = (double)(auStack_202c0._0_8_ ^ uStack_20250);
          auVar123._8_8_ = auStack_202c0._8_8_ ^ uStack_20248;
          auVar50 = vxorpd_avx512vl(auStack_202b0,auVar24);
          dStack_202d0 = (double)(uStack_20250 ^ auStack_20540._0_8_);
          uStack_202c8 = uStack_20248 ^ auStack_20540._8_8_;
          auStack_20310 = vxorpd_avx512vl(auStack_20300,auVar24);
          auStack_20320 = vxorpd_avx512vl(auStack_202e0,auVar24);
          auStack_20330 = vxorpd_avx512vl(auStack_202f0,auVar24);
          auStack_20360 = vxorpd_avx512vl(auStack_20350,auVar24);
          auStack_20370 = vxorpd_avx512vl(auStack_20210,auVar24);
          auStack_20380 = vxorpd_avx512vl(auStack_20340,auVar24);
          auStack_203a0._0_8_ = uStack_20250 ^ auStack_20230._0_8_;
          auStack_203a0._8_8_ = uStack_20248 ^ auStack_20230._8_8_;
          auStack_203b0._0_8_ = uStack_20250 ^ auStack_20390._0_8_;
          auStack_203b0._8_8_ = uStack_20248 ^ auStack_20390._8_8_;
          auStack_203c0 = vxorpd_avx512vl(auStack_20220,auVar24);
          auStack_203f0._0_8_ = auStack_203d0._0_8_ ^ uStack_20250;
          auStack_203f0._8_8_ = auStack_203d0._8_8_ ^ uStack_20248;
          auStack_20400 = vxorpd_avx512vl(auStack_203e0,auVar24);
          auStack_20410 = vxorpd_avx512vl(auVar44,auVar24);
          dStack_20120 = (double)(uStack_20250 ^ auStack_20110._0_8_);
          uStack_20118 = uStack_20248 ^ auStack_20110._8_8_;
          dStack_20130 = (double)(auStack_20240._0_8_ ^ uStack_20250);
          uStack_20128 = auStack_20240._8_8_ ^ uStack_20248;
          auStack_20140 = vxorpd_avx512vl(auStack_20420,auVar24);
          dStack_20160 = (double)(auStack_20150._0_8_ ^ uStack_20250);
          uStack_20158 = auStack_20150._8_8_ ^ uStack_20248;
          dStack_20170 = (double)(auVar48._0_8_ ^ uStack_20250);
          uStack_20168 = auVar48._8_8_ ^ uStack_20248;
          auStack_20180 = vxorpd_avx512vl(auVar45,auVar24);
          dStack_201c0 = (double)(uStack_20250 ^ auStack_201b0._0_8_);
          uStack_201b8 = uStack_20248 ^ auStack_201b0._8_8_;
          dStack_201d0 = (double)(uStack_20250 ^ auStack_201a0._0_8_);
          uStack_201c8 = uStack_20248 ^ auStack_201a0._8_8_;
          auStack_201e0 = vxorpd_avx512vl(auStack_20190,auVar24);
          do {
            dVar73 = *(double *)
                      ((long)(pMStack_205d0->
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage
                             .m_data.array + lVar34 + 0x10);
            auVar116._8_8_ = 0;
            auVar116._0_8_ = dVar73;
            dVar2 = *(double *)
                     ((long)(pMStack_205d0->
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.
                            m_data.array + lVar34);
            auVar169._8_8_ = 0;
            auVar169._0_8_ = dVar2;
            dVar3 = *(double *)
                     ((long)(pMStack_205d0->
                            super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage.
                            m_data.array + lVar34 + 8);
            auVar135._8_8_ = 0;
            auVar135._0_8_ = dVar3;
            auVar51 = vmulsd_avx512f(auVar135,auVar41);
            auVar51 = vfmadd231sd_avx512f(auVar51,auStack_20520,auVar116);
            auVar52 = vmulsd_avx512f(auVar116,auVar46);
            auVar52 = vfmadd231sd_avx512f(auVar52,auStack_20290,auVar169);
            auVar51 = vunpcklpd_avx512vl(auVar51,auVar52);
            auVar52 = vmulsd_avx512f(auVar169,auVar47);
            auVar52 = vfmadd231sd_avx512f(auVar52,auStack_20280,auVar135);
            auVar15._8_8_ = 0;
            auVar15._0_8_ =
                 *(ulong *)((long)(pMStack_205c8->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).
                                  m_storage.m_data.array + lVar34 + 0x10);
            auVar53 = vmovddup_avx512vl(auVar15);
            uVar14 = *(undefined8 *)
                      ((long)(pMStack_205c8->
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage
                             .m_data.array + lVar34);
            auVar21._8_8_ = uVar14;
            auVar21._0_8_ = uVar14;
            auVar54 = vmulpd_avx512vl(auStack_20550,auVar21);
            uVar14 = *(undefined8 *)
                      ((long)(pMStack_205c8->
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>).m_storage
                             .m_data.array + lVar34 + 8);
            auVar22._8_8_ = uVar14;
            auVar22._0_8_ = uVar14;
            auVar54 = vfmadd231pd_avx512vl(auVar54,auStack_20510,auVar22);
            auVar54 = vfmadd231pd_avx512vl(auVar54,auVar53,auVar43);
            auVar55 = vmulpd_avx512vl(auVar42,*(undefined1 (*) [16])
                                               ((long)(pMStack_205c8->
                                                                                                            
                                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_5,_0,_3,_5>_>
                                                  ).m_storage.m_data.array + lVar34));
            auVar16._8_8_ = 0;
            auVar16._0_8_ = auStack_20490._0_8_;
            auVar53 = vmulsd_avx512f(auVar53,auVar16);
            auVar57 = vshufpd_avx512vl(auVar55,auVar55,1);
            auVar53 = vaddsd_avx512f(auVar57,auVar53);
            auVar53 = vaddsd_avx512f(auVar55,auVar53);
            auVar55 = vshufpd_avx512vl(auVar54,auVar54,1);
            auVar57 = vmulsd_avx512f(auVar55,auVar41);
            auVar57 = vfmadd231sd_avx512f(auVar57,auStack_20520,auVar53);
            auVar60 = vmulsd_avx512f(auVar53,auVar46);
            auVar60 = vfmadd231sd_avx512f(auVar60,auStack_20290,auVar54);
            auVar57 = vunpcklpd_avx512vl(auVar57,auVar60);
            auVar60 = vmulsd_avx512f(auVar54,auVar47);
            auVar60 = vfmadd231sd_avx512f(auVar60,auStack_20280,auVar55);
            auVar52 = vmulsd_avx512f(auVar52,auVar60);
            if (auVar52._0_8_ + auVar57._0_8_ * auVar51._0_8_ + auVar57._8_8_ * auVar51._8_8_ < 0.0)
            goto LAB_00165da7;
            auVar51 = vmulsd_avx512f(auVar135,auVar106);
            auVar52 = vfmadd231sd_avx512f(auVar51,auStack_202a0,auVar116);
            auVar146._8_8_ = 0;
            auVar146._0_8_ = auVar107._0_8_ * dVar73;
            auVar51 = vfmadd231sd_fma(auVar146,auStack_20200,auVar169);
            auVar51 = vunpcklpd_avx(auVar52,auVar51);
            auVar52 = vmulsd_avx512f(auVar169,auVar49);
            auVar52 = vfmadd231sd_avx512f(auVar52,auStack_20530,auVar135);
            auVar57 = vmulsd_avx512f(auVar55,auVar106);
            auVar57 = vfmadd231sd_avx512f(auVar57,auStack_202a0,auVar53);
            auVar60 = vmulsd_avx512f(auVar53,auVar107);
            auVar60 = vfmadd231sd_avx512f(auVar60,auStack_20200,auVar54);
            auVar57 = vunpcklpd_avx512vl(auVar57,auVar60);
            auVar60 = vmulsd_avx512f(auVar54,auVar49);
            auVar60 = vfmadd231sd_avx512f(auVar60,auStack_20530,auVar55);
            auVar52 = vmulsd_avx512f(auVar52,auVar60);
            if (auVar52._0_8_ + auVar57._0_8_ * auVar51._0_8_ + auVar57._8_8_ * auVar51._8_8_ < 0.0)
            goto LAB_00165da7;
            auVar92._8_8_ = 0;
            auVar92._0_8_ = dVar3 * auVar123._0_8_;
            auVar52 = vfmadd231sd_avx512f(auVar92,auStack_20540,auVar116);
            auVar51 = vmulsd_avx512f(auVar116,auVar50);
            auVar51 = vfmadd231sd_fma(auVar51,auStack_202c0,auVar169);
            auVar51 = vunpcklpd_avx(auVar52,auVar51);
            auVar23._8_8_ = uStack_202c8;
            auVar23._0_8_ = dStack_202d0;
            auVar147._8_8_ = 0;
            auVar147._0_8_ = dVar2 * dStack_202d0;
            auVar52 = vfmadd231sd_avx512f(auVar147,auStack_202b0,auVar135);
            auVar57 = vmulsd_avx512f(auVar55,auVar123);
            auVar57 = vfmadd231sd_avx512f(auVar57,auStack_20540,auVar53);
            auVar60 = vmulsd_avx512f(auVar53,auVar50);
            auVar60 = vfmadd231sd_avx512f(auVar60,auStack_202c0,auVar54);
            auVar57 = vunpcklpd_avx512vl(auVar57,auVar60);
            auVar60 = vmulsd_avx512f(auVar54,auVar23);
            auVar60 = vfmadd231sd_avx512f(auVar60,auStack_202b0,auVar55);
            auVar52 = vmulsd_avx512f(auVar52,auVar60);
            if (auVar52._0_8_ + auVar57._0_8_ * auVar51._0_8_ + auVar57._8_8_ * auVar51._8_8_ < 0.0)
            goto LAB_00165da7;
            auVar93._8_8_ = 0;
            auVar93._0_8_ = dVar3 * auStack_20310._0_8_;
            auVar52 = vfmadd231sd_avx512f(auVar93,auStack_202f0,auVar116);
            auVar148._8_8_ = 0;
            auVar148._0_8_ = dVar73 * auStack_20320._0_8_;
            auVar51 = vfmadd231sd_fma(auVar148,auStack_20300,auVar169);
            auVar51 = vunpcklpd_avx(auVar52,auVar51);
            auVar149._8_8_ = 0;
            auVar149._0_8_ = dVar2 * auStack_20330._0_8_;
            auVar52 = vfmadd231sd_avx512f(auVar149,auStack_202e0,auVar135);
            auVar57 = vmulsd_avx512f(auVar55,auStack_20310);
            auVar57 = vfmadd231sd_avx512f(auVar57,auStack_202f0,auVar53);
            auVar60 = vmulsd_avx512f(auVar53,auStack_20320);
            auVar60 = vfmadd231sd_avx512f(auVar60,auStack_20300,auVar54);
            auVar57 = vunpcklpd_avx512vl(auVar57,auVar60);
            auVar60 = vmulsd_avx512f(auVar54,auStack_20330);
            auVar60 = vfmadd231sd_avx512f(auVar60,auStack_202e0,auVar55);
            auVar52 = vmulsd_avx512f(auVar52,auVar60);
            if (auVar52._0_8_ + auVar57._0_8_ * auVar51._0_8_ + auVar57._8_8_ * auVar51._8_8_ < 0.0)
            goto LAB_00165da7;
            auVar94._8_8_ = 0;
            auVar94._0_8_ = dVar3 * auStack_20360._0_8_;
            auVar51 = vfmadd231sd_avx512f(auVar94,auStack_20340,auVar116);
            auVar150._8_8_ = 0;
            auVar150._0_8_ = dVar73 * auStack_20370._0_8_;
            auVar52 = vfmadd231sd_avx512f(auVar150,auStack_20350,auVar169);
            auVar51 = vunpcklpd_avx(auVar51,auVar52);
            auVar151._8_8_ = 0;
            auVar151._0_8_ = dVar2 * auStack_20380._0_8_;
            auVar52 = vfmadd231sd_avx512f(auVar151,auStack_20210,auVar135);
            auVar57 = vmulsd_avx512f(auVar55,auStack_20360);
            auVar57 = vfmadd231sd_avx512f(auVar57,auStack_20340,auVar53);
            auVar60 = vmulsd_avx512f(auVar53,auStack_20370);
            auVar60 = vfmadd231sd_avx512f(auVar60,auStack_20350,auVar54);
            auVar57 = vunpcklpd_avx512vl(auVar57,auVar60);
            auVar60 = vmulsd_avx512f(auVar54,auStack_20380);
            auVar60 = vfmadd231sd_avx512f(auVar60,auStack_20210,auVar55);
            auVar52 = vmulsd_avx512f(auVar52,auVar60);
            if (auVar52._0_8_ + auVar57._0_8_ * auVar51._0_8_ + auVar57._8_8_ * auVar51._8_8_ < 0.0)
            goto LAB_00165da7;
            auVar95._8_8_ = 0;
            auVar95._0_8_ = dVar3 * (double)auStack_203a0._0_8_;
            auVar52 = vfmadd231sd_avx512f(auVar95,auStack_20220,auVar116);
            auVar152._8_8_ = 0;
            auVar152._0_8_ = dVar73 * (double)auStack_203b0._0_8_;
            auVar51 = vfmadd231sd_fma(auVar152,auStack_20230,auVar169);
            auVar51 = vunpcklpd_avx(auVar52,auVar51);
            auVar153._8_8_ = 0;
            auVar153._0_8_ = dVar2 * auStack_203c0._0_8_;
            auVar52 = vfmadd231sd_fma(auVar153,auStack_20390,auVar135);
            auVar57 = vmulsd_avx512f(auVar55,auStack_203a0);
            auVar57 = vfmadd231sd_avx512f(auVar57,auStack_20220,auVar53);
            auVar60 = vmulsd_avx512f(auVar53,auStack_203b0);
            auVar60 = vfmadd231sd_avx512f(auVar60,auStack_20230,auVar54);
            auVar57 = vunpcklpd_avx512vl(auVar57,auVar60);
            auVar60 = vmulsd_avx512f(auVar54,auStack_203c0);
            auVar60 = vfmadd231sd_avx512f(auVar60,auStack_20390,auVar55);
            auVar52 = vmulsd_avx512f(auVar52,auVar60);
            if (auVar52._0_8_ + auVar57._0_8_ * auVar51._0_8_ + auVar57._8_8_ * auVar51._8_8_ < 0.0)
            goto LAB_00165da7;
            auVar96._8_8_ = 0;
            auVar96._0_8_ = dVar3 * (double)auStack_203f0._0_8_;
            auVar52 = vfmadd231sd_avx512f(auVar96,auVar44,auVar116);
            auVar154._8_8_ = 0;
            auVar154._0_8_ = dVar73 * auStack_20400._0_8_;
            auVar51 = vfmadd231sd_fma(auVar154,auStack_203d0,auVar169);
            auVar51 = vunpcklpd_avx(auVar52,auVar51);
            auVar52 = vmulsd_avx512f(auVar169,auStack_20410);
            auVar52 = vfmadd231sd_fma(auVar52,auStack_203e0,auVar135);
            auVar57 = vmulsd_avx512f(auVar55,auStack_203f0);
            auVar57 = vfmadd231sd_avx512f(auVar57,auVar44,auVar53);
            auVar60 = vmulsd_avx512f(auVar53,auStack_20400);
            auVar60 = vfmadd231sd_avx512f(auVar60,auStack_203d0,auVar54);
            auVar57 = vunpcklpd_avx512vl(auVar57,auVar60);
            auVar60 = vmulsd_avx512f(auVar54,auStack_20410);
            auVar60 = vfmadd231sd_avx512f(auVar60,auStack_203e0,auVar55);
            auVar52 = vmulsd_avx512f(auVar52,auVar60);
            if (auVar52._0_8_ + auVar57._0_8_ * auVar51._0_8_ + auVar57._8_8_ * auVar51._8_8_ < 0.0)
            goto LAB_00165da7;
            auVar30._8_8_ = uStack_20118;
            auVar30._0_8_ = dStack_20120;
            auVar97._8_8_ = 0;
            auVar97._0_8_ = dVar3 * dStack_20120;
            auVar51 = vfmadd231sd_fma(auVar97,auStack_20420,auVar116);
            auVar29._8_8_ = uStack_20128;
            auVar29._0_8_ = dStack_20130;
            auVar155._8_8_ = 0;
            auVar155._0_8_ = dVar73 * dStack_20130;
            auVar52 = vfmadd231sd_avx512f(auVar155,auStack_20110,auVar169);
            auVar51 = vunpcklpd_avx(auVar51,auVar52);
            auVar156._8_8_ = 0;
            auVar156._0_8_ = dVar2 * auStack_20140._0_8_;
            auVar52 = vfmadd231sd_fma(auVar156,auStack_20240,auVar135);
            auVar57 = vmulsd_avx512f(auVar55,auVar30);
            auVar57 = vfmadd231sd_avx512f(auVar57,auStack_20420,auVar53);
            auVar60 = vmulsd_avx512f(auVar53,auVar29);
            auVar60 = vfmadd231sd_avx512f(auVar60,auStack_20110,auVar54);
            auVar57 = vunpcklpd_avx512vl(auVar57,auVar60);
            auVar60 = vmulsd_avx512f(auVar54,auStack_20140);
            auVar60 = vfmadd231sd_avx512f(auVar60,auStack_20240,auVar55);
            auVar52 = vmulsd_avx512f(auVar52,auVar60);
            if (auVar52._0_8_ + auVar57._0_8_ * auVar51._0_8_ + auVar57._8_8_ * auVar51._8_8_ < 0.0)
            goto LAB_00165da7;
            auVar28._8_8_ = uStack_20158;
            auVar28._0_8_ = dStack_20160;
            auVar98._8_8_ = 0;
            auVar98._0_8_ = dVar3 * dStack_20160;
            auVar52 = vfmadd231sd_avx512f(auVar98,auVar45,auVar116);
            auVar27._8_8_ = uStack_20168;
            auVar27._0_8_ = dStack_20170;
            auVar157._8_8_ = 0;
            auVar157._0_8_ = dVar73 * dStack_20170;
            auVar51 = vfmadd231sd_fma(auVar157,auStack_20150,auVar169);
            auVar51 = vunpcklpd_avx(auVar52,auVar51);
            auVar158._8_8_ = 0;
            auVar158._0_8_ = dVar2 * auStack_20180._0_8_;
            auVar52 = vfmadd231sd_avx512f(auVar158,auVar48,auVar135);
            auVar57 = vmulsd_avx512f(auVar55,auVar28);
            auVar57 = vfmadd231sd_avx512f(auVar57,auVar45,auVar53);
            auVar60 = vmulsd_avx512f(auVar53,auVar27);
            auVar60 = vfmadd231sd_avx512f(auVar60,auStack_20150,auVar54);
            auVar57 = vunpcklpd_avx512vl(auVar57,auVar60);
            auVar60 = vmulsd_avx512f(auVar54,auStack_20180);
            auVar60 = vfmadd231sd_avx512f(auVar60,auVar48,auVar55);
            auVar52 = vmulsd_avx512f(auVar52,auVar60);
            if (auVar52._0_8_ + auVar57._0_8_ * auVar51._0_8_ + auVar57._8_8_ * auVar51._8_8_ < 0.0)
            goto LAB_00165da7;
            auVar26._8_8_ = uStack_201b8;
            auVar26._0_8_ = dStack_201c0;
            auVar99._8_8_ = 0;
            auVar99._0_8_ = dVar3 * dStack_201c0;
            auVar51 = vfmadd231sd_fma(auVar99,auStack_20190,auVar116);
            auVar25._8_8_ = uStack_201c8;
            auVar25._0_8_ = dStack_201d0;
            auVar117._8_8_ = 0;
            auVar117._0_8_ = dStack_201d0 * dVar73;
            auVar52 = vfmadd231sd_fma(auVar117,auStack_201b0,auVar169);
            auVar51 = vunpcklpd_avx(auVar51,auVar52);
            auVar118._8_8_ = 0;
            auVar118._0_8_ = dVar2 * auStack_201e0._0_8_;
            auVar57 = vfmadd231sd_fma(auVar118,auStack_201a0,auVar135);
            auVar52 = vmulsd_avx512f(auVar55,auVar26);
            auVar52 = vfmadd231sd_avx512f(auVar52,auStack_20190,auVar53);
            auVar53 = vmulsd_avx512f(auVar53,auVar25);
            auVar53 = vfmadd231sd_avx512f(auVar53,auStack_201b0,auVar54);
            auVar52 = vunpcklpd_avx(auVar52,auVar53);
            auVar53 = vmulsd_avx512f(auVar54,auStack_201e0);
            auVar53 = vfmadd231sd_avx512f(auVar53,auStack_201a0,auVar55);
            if (auVar53._0_8_ * auVar57._0_8_ +
                auVar52._0_8_ * auVar51._0_8_ + auVar52._8_8_ * auVar51._8_8_ < 0.0)
            goto LAB_00165da7;
            lVar34 = lVar34 + 0x18;
          } while (lVar34 != 0x78);
          __position._M_current = *(Matrix<double,_3,_3,_0,_3,_3> **)(this + 8);
          if (__position._M_current == *(Matrix<double,_3,_3,_0,_3,_3> **)(this + 0x10)) {
            auStack_20270 = auVar43;
            std::
            vector<Eigen::Matrix<double,3,3,0,3,3>,Eigen::aligned_allocator<Eigen::Matrix<double,3,3,0,3,3>>>
            ::_M_realloc_insert<Eigen::Matrix<double,3,3,0,3,3>const&>
                      (this,__position,&MStack_205c0);
            auVar43 = auStack_20270;
          }
          else {
            ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
            m_storage.m_data.array[8] =
                 MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                 .m_data.array[8];
            auVar67._8_8_ = auVar100._0_8_;
            auVar67._0_8_ =
                 MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                 .m_data.array[0];
            auVar67._16_8_ =
                 MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                 .m_data.array[2];
            auVar67._24_8_ =
                 MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                 .m_data.array[3];
            auVar67._32_8_ = auVar131._0_8_;
            auVar67._40_8_ =
                 MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                 .m_data.array[5];
            auVar67._48_8_ =
                 MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                 .m_data.array[6];
            auVar67._56_8_ =
                 MStack_205c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                 .m_data.array[7];
            *(undefined1 (*) [64])
             ((__position._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>)
             .m_storage.m_data.array = auVar67;
            *(long *)(this + 8) = *(long *)(this + 8) + 0x48;
          }
        }
      }
    }
LAB_00165da7:
    auStack_20270 = auVar43;
    lVar36 = lVar36 + 1;
    if (lVar36 == 0x14) {
      if (vStack_20610.
          super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        free((void *)vStack_20610.
                     super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[-1].
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[8]);
      }
      if (vStack_205f0.
          super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        free((void *)vStack_205f0.
                     super__Vector_base<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[-1].
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[8]);
      }
      return;
    }
  } while( true );
}

Assistant:

void
opengv::relative_pose::modules::fivept_kneip_main(
    const Eigen::Matrix<double,3,5> & f1,
    const Eigen::Matrix<double,3,5> & f2,
    rotations_t & rotations )
{
  Eigen::Matrix<double,66,197> groebnerMatrix =
      Eigen::Matrix<double,66,197>::Zero();
  Eigen::Matrix3d temp1 = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d temp2 = Eigen::Matrix3d::Zero();
  std::vector<Eigen::Matrix3d, Eigen::aligned_allocator<Eigen::Matrix3d> > c_1;
  c_1.push_back(temp1);
  c_1.push_back(temp1);
  c_1.push_back(temp1);
  std::vector<Eigen::Matrix3d, Eigen::aligned_allocator<Eigen::Matrix3d> > c_2;
  c_2.push_back(temp2);
  c_2.push_back(temp2);
  c_2.push_back(temp2);

  int currentRow = 0;

  for( int firstFeat = 0; firstFeat < 5; firstFeat++ )
  {
    for( int secondFeat = firstFeat + 1; secondFeat < 5; secondFeat++ )
    {
      temp1 = f1.col(firstFeat)*f1.col(secondFeat).transpose();
      temp2 = f2.col(firstFeat)*f2.col(secondFeat).transpose();

      for( int thirdFeat = secondFeat + 1; thirdFeat < 5; thirdFeat++ )
      {
        c_1[0] = temp1 * f1(0,thirdFeat);
        c_1[1] = temp1 * f1(1,thirdFeat);
        c_1[2] = temp1 * f1(2,thirdFeat);
        c_2[0] = temp2 * f2(0,thirdFeat);
        c_2[1] = temp2 * f2(1,thirdFeat);
        c_2[2] = temp2 * f2(2,thirdFeat);

        groebnerMatrix.row(currentRow++) =
            fivept_kneip::initEpncpRowR( c_1, c_2 );
      }
    }
  }

  fivept_kneip::initMatrix(groebnerMatrix);
  fivept_kneip::computeBasis(groebnerMatrix);

  Eigen::Matrix<double,20,20> M = Eigen::Matrix<double,20,20>::Zero();
  M.block<10,20>(0,0) = -groebnerMatrix.block<10,20>(51,177);
  M(10,1) = 1.0;
  M(11,2) = 1.0;
  M(12,3) = 1.0;
  M(13,4) = 1.0;
  M(14,5) = 1.0;
  M(15,6) = 1.0;
  M(16,7) = 1.0;
  M(17,8) = 1.0;
  M(18,9) = 1.0;
  M(19,18) = 1.0;

  Eigen::EigenSolver< Eigen::Matrix<double,20,20> > Eig(M,true);
  Eigen::Matrix<std::complex<double>,20,1> D = Eig.eigenvalues();
  Eigen::Matrix<std::complex<double>,20,20> V = Eig.eigenvectors();

  //Eigen::Matrix<std::complex<double>,9,1> tempVector;
  rotation_t finalRotation = Eigen::Matrix3d::Zero();
  for( unsigned int i = 0; i < 20; i++ )
  {
    std::complex<double> tempp;
    tempp = D[i];

    //check if we have a real solution
    if( fabs(tempp.imag()) < 0.1 )
    {
      tempp = V(18,i)/V(19,i);
      finalRotation(0,0) = tempp.real();// tempVector[0] = tempp;
      tempp = V(17,i)/V(19,i);
      finalRotation(0,1) = tempp.real();// tempVector[1] = tempp;
      tempp = V(16,i)/V(19,i);
      finalRotation(0,2) = tempp.real();// tempVector[2] = tempp;
      tempp = V(15,i)/V(19,i);
      finalRotation(1,0) = tempp.real();// tempVector[3] = tempp;
      tempp = V(14,i)/V(19,i);
      finalRotation(1,1) = tempp.real();// tempVector[4] = tempp;
      tempp = V(13,i)/V(19,i);
      finalRotation(1,2) = tempp.real();// tempVector[5] = tempp;
      tempp = V(12,i)/V(19,i);
      finalRotation(2,0) = tempp.real();// tempVector[6] = tempp;
      tempp = V(11,i)/V(19,i);
      finalRotation(2,1) = tempp.real();// tempVector[7] = tempp;
      tempp = V(10,i)/V(19,i);
      finalRotation(2,2) = tempp.real();// tempVector[8] = tempp;

      double tempNorm = finalRotation.row(1).norm();
      finalRotation.row(1) = finalRotation.row(1) / tempNorm;
      tempNorm = finalRotation.row(2).norm();
      finalRotation.row(2) = finalRotation.row(2) / tempNorm;

      //check if the normalized rotation matrix has determinant close enough to 1
      if( fabs( finalRotation.determinant() - 1.0 ) < 0.1 )
      {
        Eigen::Matrix3d eval;
        double totalEval = 0.0;
        eval.col(0) = f1.col(0).cross(finalRotation*f2.col(0));
        eval.col(1) = f1.col(1).cross(finalRotation*f2.col(1));
        eval.col(2) = f1.col(2).cross(finalRotation*f2.col(2));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(0).cross(finalRotation*f2.col(0));
        eval.col(1) = f1.col(1).cross(finalRotation*f2.col(1));
        eval.col(2) = f1.col(3).cross(finalRotation*f2.col(3));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(0).cross(finalRotation*f2.col(0));
        eval.col(1) = f1.col(1).cross(finalRotation*f2.col(1));
        eval.col(2) = f1.col(4).cross(finalRotation*f2.col(4));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(0).cross(finalRotation*f2.col(0));
        eval.col(1) = f1.col(2).cross(finalRotation*f2.col(2));
        eval.col(2) = f1.col(3).cross(finalRotation*f2.col(3));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(0).cross(finalRotation*f2.col(0));
        eval.col(1) = f1.col(2).cross(finalRotation*f2.col(2));
        eval.col(2) = f1.col(4).cross(finalRotation*f2.col(4));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(0).cross(finalRotation*f2.col(0));
        eval.col(1) = f1.col(3).cross(finalRotation*f2.col(3));
        eval.col(2) = f1.col(4).cross(finalRotation*f2.col(4));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(1).cross(finalRotation*f2.col(1));
        eval.col(1) = f1.col(2).cross(finalRotation*f2.col(2));
        eval.col(2) = f1.col(3).cross(finalRotation*f2.col(3));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(1).cross(finalRotation*f2.col(1));
        eval.col(1) = f1.col(2).cross(finalRotation*f2.col(2));
        eval.col(2) = f1.col(4).cross(finalRotation*f2.col(4));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(1).cross(finalRotation*f2.col(1));
        eval.col(1) = f1.col(3).cross(finalRotation*f2.col(3));
        eval.col(2) = f1.col(4).cross(finalRotation*f2.col(4));
        totalEval += fabs(eval.determinant());
        eval.col(0) = f1.col(2).cross(finalRotation*f2.col(2));
        eval.col(1) = f1.col(3).cross(finalRotation*f2.col(3));
        eval.col(2) = f1.col(4).cross(finalRotation*f2.col(4));
        totalEval += fabs(eval.determinant());
        totalEval += fabs(
            finalRotation(0,0)*finalRotation(0,0)+
            finalRotation(0,1)*finalRotation(0,1)+
            finalRotation(0,2)*finalRotation(0,2)-1);
        totalEval += fabs(
            finalRotation(0,0)*finalRotation(1,0)+
            finalRotation(0,1)*finalRotation(1,1)+
            finalRotation(0,2)*finalRotation(1,2));
        totalEval += fabs(
            finalRotation(0,0)*finalRotation(2,0)+
            finalRotation(0,1)*finalRotation(2,1)+
            finalRotation(0,2)*finalRotation(2,2));
        totalEval += fabs(
            finalRotation(1,0)*finalRotation(1,0)+
            finalRotation(1,1)*finalRotation(1,1)+
            finalRotation(1,2)*finalRotation(1,2)-1);
        totalEval += fabs(
            finalRotation(1,0)*finalRotation(2,0)+
            finalRotation(1,1)*finalRotation(2,1)+
            finalRotation(1,2)*finalRotation(2,2));
        totalEval += fabs(
            finalRotation(2,0)*finalRotation(2,0)+
            finalRotation(2,1)*finalRotation(2,1)+
            finalRotation(2,2)*finalRotation(2,2)-1);
        totalEval += fabs(
            finalRotation(1,0)*finalRotation(2,1)-
            finalRotation(2,0)*finalRotation(1,1)-finalRotation(0,2));
        totalEval += fabs(
            finalRotation(2,0)*finalRotation(0,1)-
            finalRotation(0,0)*finalRotation(2,1)-finalRotation(1,2));
        totalEval += fabs(
            finalRotation(0,0)*finalRotation(1,1)-
            finalRotation(1,0)*finalRotation(0,1)-finalRotation(2,2));

        //check if the initial constraints are fullfilled to a sufficient extend
        if( totalEval < 0.001 )
        {
          Eigen::Matrix<double,3,5> normalVectors;
          normalVectors.col(0) = f1.col(0).cross(finalRotation * f2.col(0));
          normalVectors.col(1) = f1.col(1).cross(finalRotation * f2.col(1));
          normalVectors.col(2) = f1.col(2).cross(finalRotation * f2.col(2));
          normalVectors.col(3) = f1.col(3).cross(finalRotation * f2.col(3));
          normalVectors.col(4) = f1.col(4).cross(finalRotation * f2.col(4));

          Eigen::Vector3d trans01 =
              normalVectors.col(0).cross(normalVectors.col(1));
          Eigen::Vector3d trans02 =
              normalVectors.col(0).cross(normalVectors.col(2));
          Eigen::Vector3d trans03 =
              normalVectors.col(0).cross(normalVectors.col(3));
          Eigen::Vector3d trans04 =
              normalVectors.col(0).cross(normalVectors.col(4));
          Eigen::Vector3d trans12 =
              normalVectors.col(1).cross(normalVectors.col(2));
          Eigen::Vector3d trans13 =
              normalVectors.col(1).cross(normalVectors.col(3));
          Eigen::Vector3d trans14 =
              normalVectors.col(1).cross(normalVectors.col(4));
          Eigen::Vector3d trans23 =
              normalVectors.col(2).cross(normalVectors.col(3));
          Eigen::Vector3d trans24 =
              normalVectors.col(2).cross(normalVectors.col(4));
          Eigen::Vector3d trans34 =
              normalVectors.col(3).cross(normalVectors.col(4));

          Eigen::Vector3d tempVector1;
          Eigen::Vector3d tempVector2;

          bool positive = true;

          for( int i = 0; i < 5; i++ )
          {
            tempVector1 = trans01.cross( f1.col(i) );
            tempVector2 = trans01.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans02.cross( f1.col(i) );
            tempVector2 = trans02.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans03.cross( f1.col(i) );
            tempVector2 = trans03.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans04.cross( f1.col(i) );
            tempVector2 = trans04.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans12.cross( f1.col(i) );
            tempVector2 = trans12.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans13.cross( f1.col(i) );
            tempVector2 = trans13.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans14.cross( f1.col(i) );
            tempVector2 = trans14.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans23.cross( f1.col(i) );
            tempVector2 = trans23.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans24.cross( f1.col(i) );
            tempVector2 = trans24.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
            tempVector1 = trans34.cross( f1.col(i) );
            tempVector2 = trans34.cross( finalRotation * f2.col(i) );
            if( tempVector1.dot(tempVector2) < 0 )
            {
              positive = false;
              break;
            }
          }

          //finally, check if the cheiriality constraint is fullfilled to
          //sufficient extend
          if( positive )
            rotations.push_back(finalRotation);
        }
      }
    }
  }
}